

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O3

UA_StatusCode SecureChannelHandshake(UA_Client *client,UA_Boolean renew)

{
  UA_Connection *connection;
  UA_ByteString *p;
  UA_Byte *pUVar1;
  size_t sVar2;
  UA_Boolean UVar3;
  UA_StatusCode UVar4;
  UA_StatusCode UVar5;
  UA_StatusCode UVar6;
  UA_StatusCode UVar7;
  UA_StatusCode UVar8;
  long lVar9;
  long lVar10;
  undefined8 uVar11;
  char *msg;
  int iVar12;
  undefined7 in_register_00000031;
  undefined8 local_258;
  size_t sStack_250;
  UA_Byte *local_248;
  long local_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  ulong local_1e8;
  undefined8 uStack_1e0;
  size_t local_1d8;
  UA_Byte *pUStack_1d0;
  undefined8 local_1c8;
  undefined1 local_1c0 [8];
  timespec ts;
  undefined8 local_130;
  UA_DateTime UStack_128;
  uint local_120;
  undefined4 uStack_11c;
  undefined1 local_118 [16];
  undefined1 local_108 [8];
  timespec ts_1;
  undefined1 local_c8 [8];
  UA_NodeId expectedRequest;
  UA_NodeId id;
  UA_UInt32 local_8c;
  UA_UInt32 local_88;
  UA_SequenceHeader seqHeader;
  size_t local_70;
  UA_ByteString local_68;
  int local_4c;
  undefined1 local_48 [8];
  UA_ByteString message;
  UA_Boolean realloced;
  
  iVar12 = (int)CONCAT71(in_register_00000031,renew);
  if ((iVar12 != 0) &&
     (lVar10 = client->nextChannelRenewal, clock_gettime(4,(timespec *)local_1c0),
     CONCAT44(ts.tv_sec._4_4_,(undefined4)ts.tv_sec) / 100 + (long)local_1c0 * 10000000 < lVar10)) {
    return 0;
  }
  UVar4 = 0x800d0000;
  if ((client->connection).state == UA_CONNECTION_ESTABLISHED) {
    connection = &client->connection;
    UVar4 = (*(client->connection).getSendBuffer)
                      (connection,(ulong)(client->connection).remoteConf.recvBufferSize,
                       (UA_ByteString *)local_48);
    if (UVar4 == 0) {
      ts_1.tv_nsec = 0x2f;
      pos = (UA_Byte *)(message.length + 0xc);
      end = (UA_Byte *)(message.length + (long)local_48);
      exchangeBufferCallback = (UA_exchangeEncodeBuffer)0x0;
      exchangeBufferCallbackHandle = (void *)0x0;
      encodeBuf = (UA_ByteString *)local_48;
      UVar5 = UA_encodeBinaryInternal(&ts_1.tv_nsec,UA_TRANSPORT + 5);
      local_8c = (client->channel).sendSequenceNumber + 1;
      (client->channel).sendSequenceNumber = local_8c;
      local_88 = client->requestId + 1;
      client->requestId = local_88;
      end = (UA_Byte *)(message.length + (long)local_48);
      exchangeBufferCallback = (UA_exchangeEncodeBuffer)0x0;
      exchangeBufferCallbackHandle = (void *)0x0;
      encodeBuf = (UA_ByteString *)local_48;
      UVar6 = UA_encodeBinaryInternal(&local_8c,UA_TRANSPORT + 7);
      local_70 = (long)pos - message.length;
      expectedRequest.identifier._8_2_ = 0;
      stack0xffffffffffffff54 = 0x1be00000000;
      end = (UA_Byte *)(message.length + (long)local_48);
      exchangeBufferCallback = (UA_exchangeEncodeBuffer)0x0;
      exchangeBufferCallbackHandle = (void *)0x0;
      encodeBuf = (UA_ByteString *)local_48;
      UVar7 = UA_encodeBinaryInternal
                        ((void *)((long)&expectedRequest.identifier + 8),UA_TYPES + 0x10);
      sVar2 = message.length;
      pUVar1 = pos;
      local_1c8 = 0;
      local_1d8 = 0;
      pUStack_1d0 = (UA_Byte *)0x0;
      local_1e8 = 0;
      uStack_1e0 = 0;
      local_1f8 = 0;
      uStack_1f0 = 0;
      local_208 = 0;
      uStack_200 = 0;
      local_218 = 0;
      uStack_210 = 0;
      local_228 = 0;
      uStack_220 = 0;
      local_238 = 0;
      uStack_230 = 0;
      gettimeofday((timeval *)local_1c0,(__timezone_ptr_t)0x0);
      local_240 = (long)local_1c0 * 10000000 + CONCAT44(ts.tv_sec._4_4_,(undefined4)ts.tv_sec) * 10
                  + 0x19db1ded53e8000;
      local_258._0_2_ = (client->authenticationToken).namespaceIndex;
      local_258._2_2_ = *(undefined2 *)&(client->authenticationToken).field_0x2;
      local_258._4_4_ = (client->authenticationToken).identifierType;
      sStack_250 = (client->authenticationToken).identifier.string.length;
      local_248 = (client->authenticationToken).identifier.string.data;
      local_1e8 = (ulong)CONCAT14(renew,(undefined4)local_1e8);
      uStack_1e0 = CONCAT44(uStack_1e0._4_4_,1);
      local_1d8 = (client->channel).clientNonce.length;
      pUStack_1d0 = (client->channel).clientNonce.data;
      local_1c8 = CONCAT44(local_1c8._4_4_,(client->config).secureChannelLifeTime);
      pos = pUVar1 + (message.length - sVar2);
      end = (UA_Byte *)(message.length + (long)local_48);
      exchangeBufferCallback = (UA_exchangeEncodeBuffer)0x0;
      exchangeBufferCallbackHandle = (void *)0x0;
      encodeBuf = (UA_ByteString *)local_48;
      local_4c = iVar12;
      UVar8 = UA_encodeBinaryInternal(&local_258,UA_TYPES + 0x61);
      local_70 = (long)pos - message.length;
      seqHeader.sequenceNumber = 0x464e504f;
      seqHeader.requestId = (UA_UInt32)local_70;
      pos = (UA_Byte *)message.length;
      end = (UA_Byte *)(message.length + (long)local_48);
      exchangeBufferCallback = (UA_exchangeEncodeBuffer)0x0;
      exchangeBufferCallbackHandle = (void *)0x0;
      encodeBuf = (UA_ByteString *)local_48;
      UVar4 = UA_encodeBinaryInternal(&seqHeader,UA_TRANSPORT + 0xb);
      UVar4 = UVar8 | UVar7 | UVar6 | UVar5 | UVar4;
      if (UVar4 == 0) {
        local_48 = (undefined1  [8])(ulong)seqHeader.requestId;
        UVar4 = (*(client->connection).send)(connection,(UA_ByteString *)local_48);
        if (UVar4 == 0) {
          local_68.length = 0;
          local_68.data = (UA_Byte *)0x0;
          message.data._7_1_ = '\0';
          UVar4 = UA_Connection_receiveChunksBlocking
                            (connection,&local_68,(UA_Boolean *)((long)&message.data + 7),
                             (client->config).timeout);
          if (UVar4 == 0) {
            local_70 = 0;
            UVar4 = UA_decodeBinary(&local_68,&local_70,&seqHeader,UA_TRANSPORT + 0xb);
            UVar5 = UA_decodeBinary(&local_68,&local_70,&ts_1.tv_nsec,UA_TRANSPORT + 5);
            UVar6 = UA_decodeBinary(&local_68,&local_70,&local_8c,UA_TRANSPORT + 7);
            UVar7 = UA_decodeBinary(&local_68,&local_70,
                                    (void *)((long)&expectedRequest.identifier + 8),UA_TYPES + 0x10)
            ;
            local_c8._0_2_ = 0;
            stack0xffffffffffffff3c = 0x1c100000000;
            if ((UVar7 == 0 && (UVar6 == 0 && (UVar5 == 0 && UVar4 == 0))) &&
               (UVar3 = UA_NodeId_equal((UA_NodeId *)((long)&expectedRequest.identifier + 8),
                                        (UA_NodeId *)local_c8), UVar3)) {
              (client->channel).receiveSequenceNumber = local_8c;
              UVar4 = UA_decodeBinary(&local_68,&local_70,local_1c0,UA_TYPES + 0x54);
              if (message.data._7_1_ == '\0') {
                (*(client->connection).releaseRecvBuffer)(connection,&local_68);
              }
              else {
                deleteMembers_noInit(&local_68,UA_TYPES + 0xe);
                local_68.length = 0;
                local_68.data = (UA_Byte *)0x0;
              }
              UVar4 = UVar4 | ts.tv_sec._4_4_;
              if (UVar4 == 0) {
                clock_gettime(4,(timespec *)local_108);
                client->nextChannelRenewal =
                     (long)((double)local_120 * 10000.0 * 0.75) +
                     ts_1.tv_sec / 100 + (long)local_108 * 10000000;
                (client->channel).securityToken.channelId = (undefined4)local_130;
                (client->channel).securityToken.tokenId = local_130._4_4_;
                (client->channel).securityToken.createdAt = UStack_128;
                *(ulong *)&(client->channel).securityToken.revisedLifetime =
                     CONCAT44(uStack_11c,local_120);
                p = &(client->channel).serverNonce;
                deleteMembers_noInit(p,UA_TYPES + 0xe);
                (client->channel).serverNonce.length = 0;
                (client->channel).serverNonce.data = (UA_Byte *)0x0;
                UA_copy(local_118,p,UA_TYPES + 0xe);
              }
              else {
                lVar10 = 0;
                if ((char)local_4c == '\0') {
                  lVar9 = 0x141ba0;
                  do {
                    if (*(uint *)((long)&statusCodeDescriptions[0].code + lVar10) == UVar4) {
                      lVar9 = (long)&statusCodeDescriptions[0].code + lVar10;
                      break;
                    }
                    lVar10 = lVar10 + 0x18;
                  } while (lVar10 != 0x1578);
                  uVar11 = *(undefined8 *)(lVar9 + 8);
                  msg = "SecureChannel could not be opened with error code %s";
                }
                else {
                  lVar9 = 0x141ba0;
                  do {
                    if (*(uint *)((long)&statusCodeDescriptions[0].code + lVar10) == UVar4) {
                      lVar9 = (long)&statusCodeDescriptions[0].code + lVar10;
                      break;
                    }
                    lVar10 = lVar10 + 0x18;
                  } while (lVar10 != 0x1578);
                  uVar11 = *(undefined8 *)(lVar9 + 8);
                  msg = "SecureChannel could not be renewed with error code %s";
                }
                UA_LOG_INFO((client->config).logger,UA_LOGCATEGORY_SECURECHANNEL,msg,uVar11);
              }
              deleteMembers_noInit(&ts_1.tv_nsec,UA_TRANSPORT + 5);
              ts_1.tv_nsec = 0;
              deleteMembers_noInit(local_1c0,UA_TYPES + 0x54);
            }
            else {
              deleteMembers_noInit(&local_68,UA_TYPES + 0xe);
              local_68.length = 0;
              local_68.data = (UA_Byte *)0x0;
              deleteMembers_noInit(&ts_1.tv_nsec,UA_TRANSPORT + 5);
              ts_1.tv_nsec = 0;
              deleteMembers_noInit((void *)((long)&expectedRequest.identifier + 8),UA_TYPES + 0x10);
              UVar4 = 0x80020000;
            }
          }
        }
      }
      else {
        (*(client->connection).releaseSendBuffer)(connection,(UA_ByteString *)local_48);
      }
    }
  }
  return UVar4;
}

Assistant:

static UA_StatusCode
SecureChannelHandshake(UA_Client *client, UA_Boolean renew) {
    /* Check if sc is still valid */
    if(renew && client->nextChannelRenewal - UA_DateTime_nowMonotonic() > 0)
        return UA_STATUSCODE_GOOD;

    UA_Connection *conn = &client->connection;
    if(conn->state != UA_CONNECTION_ESTABLISHED)
        return UA_STATUSCODE_BADSERVERNOTCONNECTED;

    UA_ByteString message;
    UA_StatusCode retval = conn->getSendBuffer(conn, conn->remoteConf.recvBufferSize, &message);
    if(retval != UA_STATUSCODE_GOOD)
        return retval;

    /* Jump over the messageHeader that will be encoded last */
    size_t offset = 12;

    /* Encode the Asymmetric Security Header */
    UA_AsymmetricAlgorithmSecurityHeader asymHeader;
    UA_AsymmetricAlgorithmSecurityHeader_init(&asymHeader);
    asymHeader.securityPolicyUri = UA_STRING("http://opcfoundation.org/UA/SecurityPolicy#None");
    retval = UA_AsymmetricAlgorithmSecurityHeader_encodeBinary(&asymHeader, &message, &offset);

    /* Encode the sequence header */
    UA_SequenceHeader seqHeader;
    seqHeader.sequenceNumber = ++client->channel.sendSequenceNumber;
    seqHeader.requestId = ++client->requestId;
    retval |= UA_SequenceHeader_encodeBinary(&seqHeader, &message, &offset);

    /* Encode the NodeId of the OpenSecureChannel Service */
    UA_NodeId requestType =
        UA_NODEID_NUMERIC(0, UA_TYPES[UA_TYPES_OPENSECURECHANNELREQUEST].binaryEncodingId);
    retval |= UA_NodeId_encodeBinary(&requestType, &message, &offset);

    /* Encode the OpenSecureChannelRequest */
    UA_OpenSecureChannelRequest opnSecRq;
    UA_OpenSecureChannelRequest_init(&opnSecRq);
    opnSecRq.requestHeader.timestamp = UA_DateTime_now();
    opnSecRq.requestHeader.authenticationToken = client->authenticationToken;
    if(renew) {
        opnSecRq.requestType = UA_SECURITYTOKENREQUESTTYPE_RENEW;
        UA_LOG_DEBUG(client->config.logger, UA_LOGCATEGORY_SECURECHANNEL,
                     "Requesting to renew the SecureChannel");
    } else {
        opnSecRq.requestType = UA_SECURITYTOKENREQUESTTYPE_ISSUE;
        UA_LOG_DEBUG(client->config.logger, UA_LOGCATEGORY_SECURECHANNEL,
                     "Requesting to open a SecureChannel");
    }
    opnSecRq.securityMode = UA_MESSAGESECURITYMODE_NONE;
    opnSecRq.clientNonce = client->channel.clientNonce;
    opnSecRq.requestedLifetime = client->config.secureChannelLifeTime;
    retval |= UA_OpenSecureChannelRequest_encodeBinary(&opnSecRq, &message, &offset);

    /* Encode the message header at the beginning */
    UA_SecureConversationMessageHeader messageHeader;
    messageHeader.messageHeader.messageTypeAndChunkType = UA_MESSAGETYPE_OPN + UA_CHUNKTYPE_FINAL;
    messageHeader.messageHeader.messageSize = (UA_UInt32)offset;
    if(renew)
        messageHeader.secureChannelId = client->channel.securityToken.channelId;
    else
        messageHeader.secureChannelId = 0;
    offset = 0;
    retval |= UA_SecureConversationMessageHeader_encodeBinary(&messageHeader, &message, &offset);

    /* Clean up and return if encoding the message failed */
    if(retval != UA_STATUSCODE_GOOD) {
        client->connection.releaseSendBuffer(&client->connection, &message);
        return retval;
    }

    /* Send the message */
    message.length = messageHeader.messageHeader.messageSize;
    retval = conn->send(conn, &message);
    if(retval != UA_STATUSCODE_GOOD)
        return retval;

    /* Receive the response */
    UA_ByteString reply = UA_BYTESTRING_NULL;
    UA_Boolean realloced = false;
    retval = UA_Connection_receiveChunksBlocking(conn, &reply, &realloced,
                                                 client->config.timeout);
    if(retval != UA_STATUSCODE_GOOD) {
        UA_LOG_DEBUG(client->config.logger, UA_LOGCATEGORY_SECURECHANNEL,
                     "Receiving OpenSecureChannelResponse failed");
        return retval;
    }

    /* Decode the header */
    offset = 0;
    retval = UA_SecureConversationMessageHeader_decodeBinary(&reply, &offset, &messageHeader);
    retval |= UA_AsymmetricAlgorithmSecurityHeader_decodeBinary(&reply, &offset, &asymHeader);
    retval |= UA_SequenceHeader_decodeBinary(&reply, &offset, &seqHeader);
    retval |= UA_NodeId_decodeBinary(&reply, &offset, &requestType);
    UA_NodeId expectedRequest =
        UA_NODEID_NUMERIC(0, UA_TYPES[UA_TYPES_OPENSECURECHANNELRESPONSE].binaryEncodingId);
    if(retval != UA_STATUSCODE_GOOD || !UA_NodeId_equal(&requestType, &expectedRequest)) {
        UA_ByteString_deleteMembers(&reply);
        UA_AsymmetricAlgorithmSecurityHeader_deleteMembers(&asymHeader);
        UA_NodeId_deleteMembers(&requestType);
        UA_LOG_DEBUG(client->config.logger, UA_LOGCATEGORY_CLIENT,
                     "Reply answers the wrong request. Expected OpenSecureChannelResponse.");
        return UA_STATUSCODE_BADINTERNALERROR;
    }

    /* Save the sequence number from server */
    client->channel.receiveSequenceNumber = seqHeader.sequenceNumber;

    /* Decode the response */
    UA_OpenSecureChannelResponse response;
    retval = UA_OpenSecureChannelResponse_decodeBinary(&reply, &offset, &response);

    /* Free the message */
    if(!realloced)
        conn->releaseRecvBuffer(conn, &reply);
    else
        UA_ByteString_deleteMembers(&reply);

    /* Results in either the StatusCode of decoding or the service */
    retval |= response.responseHeader.serviceResult;

    if(retval == UA_STATUSCODE_GOOD) {
        /* Response.securityToken.revisedLifetime is UInt32 we need to cast it
         * to DateTime=Int64 we take 75% of lifetime to start renewing as
         *  described in standard */
        client->nextChannelRenewal = UA_DateTime_nowMonotonic() +
            (UA_DateTime)(response.securityToken.revisedLifetime * (UA_Double)UA_MSEC_TO_DATETIME * 0.75);

        /* Replace the old nonce */
        UA_ChannelSecurityToken_deleteMembers(&client->channel.securityToken);
        UA_ChannelSecurityToken_copy(&response.securityToken, &client->channel.securityToken);
        UA_ByteString_deleteMembers(&client->channel.serverNonce);
        UA_ByteString_copy(&response.serverNonce, &client->channel.serverNonce);

        if(renew)
            UA_LOG_DEBUG(client->config.logger, UA_LOGCATEGORY_SECURECHANNEL,
                         "SecureChannel renewed");
        else
            UA_LOG_DEBUG(client->config.logger, UA_LOGCATEGORY_SECURECHANNEL,
                         "SecureChannel opened");
    } else {
        if(renew)
            UA_LOG_INFO(client->config.logger, UA_LOGCATEGORY_SECURECHANNEL,
                        "SecureChannel could not be renewed "
                        "with error code %s", UA_StatusCode_name(retval));
        else
            UA_LOG_INFO(client->config.logger, UA_LOGCATEGORY_SECURECHANNEL,
                        "SecureChannel could not be opened "
                        "with error code %s", UA_StatusCode_name(retval));
    }

    /* Clean up */
    UA_AsymmetricAlgorithmSecurityHeader_deleteMembers(&asymHeader);
    UA_OpenSecureChannelResponse_deleteMembers(&response);
    return retval;
}